

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator cVar3;
  long *plVar4;
  const_iterator cVar5;
  ulong uVar6;
  ulong *puVar7;
  size_type *psVar8;
  _Alloc_hider _Var9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var10;
  _Base_ptr p_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Alloc_hider _Var13;
  undefined8 uVar14;
  ulong uVar15;
  _Base_ptr __rhs;
  _Alloc_hider _Var16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  String *local_170;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  _Base_ptr local_100;
  undefined2 *local_f8;
  _Base_ptr local_f0;
  undefined2 local_e8;
  undefined1 uStack_e6;
  undefined5 uStack_e5;
  pointer local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Options *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_38;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_88 = this;
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar12 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar12;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_170 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_120," ",g);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
      paVar1 = &local_190.field_2;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_190.field_2._M_allocated_capacity = *puVar7;
        local_190.field_2._8_8_ = plVar4[3];
        local_190._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar7;
        local_190._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_168.first._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      paVar2 = &local_168.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == paVar1) {
        local_168.first.field_2._8_8_ = local_190.field_2._8_8_;
        local_168.first._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_168.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
      }
      local_168.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_168.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_168.first._M_dataplus._M_p,
                        local_168.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    __rhs = *(_Base_ptr *)(cVar3._M_node + 4);
    local_100 = cVar3._M_node[4]._M_parent;
    local_128 = paVar12;
    local_d8 = (pointer)cVar3;
    if (__rhs == local_100) {
      p_Var11 = (_Base_ptr)0x0;
    }
    else {
      local_b0 = &(local_88->m_positional_set)._M_h;
      paVar12 = &local_168.first.field_2;
      paVar1 = &local_190.field_2;
      p_Var11 = (_Base_ptr)0x0;
      do {
        if ((*(char *)&__rhs[6]._M_left != '\x01') ||
           (cVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(local_b0,(key_type *)(__rhs + 1)),
           cVar5.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur == (__node_type *)0x0)) {
          local_f8 = &local_e8;
          local_e8 = 0x2020;
          local_f0 = (_Base_ptr)0x2;
          uStack_e6 = 0;
          if (__rhs->_M_parent == (_Base_ptr)0x0) {
            std::__cxx11::string::append((char *)&local_f8);
          }
          else {
            std::operator+(&local_190,"-",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
            puVar7 = (ulong *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_168.first.field_2._M_allocated_capacity = *puVar7;
              local_168.first.field_2._8_8_ = plVar4[3];
              local_168.first._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_168.first.field_2._M_allocated_capacity = *puVar7;
              local_168.first._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_168.first._M_string_length = plVar4[1];
            *plVar4 = (long)puVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_f8,(ulong)local_168.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168.first._M_dataplus._M_p != paVar12) {
              operator_delete(local_168.first._M_dataplus._M_p,
                              local_168.first.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != paVar1) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (__rhs[1]._M_parent != (_Base_ptr)0x0) {
            std::operator+(&local_168.first," --",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (__rhs + 1));
            std::__cxx11::string::_M_append
                      ((char *)&local_f8,(ulong)local_168.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168.first._M_dataplus._M_p != paVar12) {
              operator_delete(local_168.first._M_dataplus._M_p,
                              local_168.first.field_2._M_allocated_capacity + 1);
            }
          }
          if ((char)__rhs[3]._M_color == _S_black) {
            if (__rhs[5]._M_right == (_Base_ptr)0x0) {
              local_168.first._M_string_length = 3;
              local_168.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
              local_168.first._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_168.first._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_168,__rhs[5]._M_left,
                         (long)&(__rhs[5]._M_left)->_M_color + (long)&(__rhs[5]._M_right)->_M_color)
              ;
            }
            if (*(char *)&__rhs[4]._M_parent == '\x01') {
              std::operator+(&local_80," [=",&local_168.first);
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              psVar8 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_a8.field_2._M_allocated_capacity = *psVar8;
                local_a8.field_2._8_8_ = plVar4[3];
              }
              else {
                local_a8.field_2._M_allocated_capacity = *psVar8;
                local_a8._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_a8._M_string_length = plVar4[1];
              *plVar4 = (long)psVar8;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a8,(ulong)__rhs[4]._M_left);
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              puVar7 = (ulong *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar7) {
                local_120.field_2._M_allocated_capacity = *puVar7;
                local_120.field_2._8_8_ = plVar4[3];
              }
              else {
                local_120.field_2._M_allocated_capacity = *puVar7;
                local_120._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_120._M_string_length = plVar4[1];
              *plVar4 = (long)puVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
              puVar7 = (ulong *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar7) {
                local_190.field_2._M_allocated_capacity = *puVar7;
                local_190.field_2._8_8_ = plVar4[3];
                local_190._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_190.field_2._M_allocated_capacity = *puVar7;
                local_190._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_190._M_string_length = plVar4[1];
              *plVar4 = (long)puVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_190._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != paVar1) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar14 = CONCAT62(local_80.field_2._M_allocated_capacity._2_6_,
                                  local_80.field_2._M_allocated_capacity._0_2_);
                _Var9._M_p = local_80._M_dataplus._M_p;
LAB_00120e6c:
                operator_delete(_Var9._M_p,uVar14 + 1);
              }
            }
            else {
              std::operator+(&local_190," ",&local_168.first);
              std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_190._M_dataplus._M_p);
              uVar14 = local_190.field_2._M_allocated_capacity;
              _Var9._M_p = local_190._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != paVar1) goto LAB_00120e6c;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168.first._M_dataplus._M_p != paVar12) {
              operator_delete(local_168.first._M_dataplus._M_p,
                              local_168.first.field_2._M_allocated_capacity + 1);
            }
          }
          if (p_Var11 <= local_f0) {
            p_Var11 = local_f0;
          }
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          local_168.first._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_f8,(long)&local_f0->_M_color + (long)local_f8);
          local_168.second._M_dataplus._M_p = (pointer)&local_168.second.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar1) {
            local_168.second.field_2._8_8_ = local_190.field_2._8_8_;
          }
          else {
            local_168.second._M_dataplus._M_p = local_190._M_dataplus._M_p;
          }
          local_168.second.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
          local_168.second._M_string_length = local_190._M_string_length;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_58,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.second._M_dataplus._M_p != &local_168.second.field_2) {
            operator_delete(local_168.second._M_dataplus._M_p,
                            local_168.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_168.first._M_dataplus._M_p,
                            local_168.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar1) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,CONCAT53(uStack_e5,CONCAT12(uStack_e6,local_e8)) + 1);
          }
        }
        __rhs = (_Base_ptr)&__rhs[6]._M_right;
      } while (__rhs != local_100);
    }
    local_60 = (_Base_ptr)0x1e;
    if (p_Var11 < (_Base_ptr)0x1e) {
      local_60 = p_Var11;
    }
    p_Var10 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_d8[2].first._M_dataplus._M_p;
    local_38 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_d8[2].first._M_string_length;
    __return_storage_ptr__ = local_170;
    if (p_Var10 != local_38) {
      uVar15 = 0x4a - (long)local_60;
      local_d8 = local_58.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_88 = (Options *)&local_88->m_positional_set;
      local_100 = (_Base_ptr)((long)&local_60->_M_color + 2);
      do {
        paVar12 = &local_120.field_2;
        local_b0 = p_Var10;
        if (((char)p_Var10[3]._M_rehash_policy._M_next_resize != '\x01') ||
           (cVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_88,(key_type *)&p_Var10->_M_rehash_policy),
           cVar5.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur == (__node_type *)0x0)) {
          p_Var10 = local_b0;
          local_168.first._M_dataplus._M_p = (pointer)&local_168.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,local_b0[1]._M_bucket_count,
                     (long)&(local_b0[1]._M_before_begin._M_nxt)->_M_nxt +
                     local_b0[1]._M_bucket_count);
          if (*(char *)((long)&p_Var10[1]._M_rehash_policy._M_next_resize + 1) == '\x01') {
            std::operator+(&local_a8," (default: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_Var10[1]._M_single_bucket);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
            puVar7 = (ulong *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_120.field_2._M_allocated_capacity = *puVar7;
              local_120.field_2._8_8_ = plVar4[3];
              local_120._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_120.field_2._M_allocated_capacity = *puVar7;
              local_120._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_190._M_string_length = plVar4[1];
            *plVar4 = (long)puVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p == paVar12) {
              local_190.field_2._8_8_ = local_120.field_2._8_8_;
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            }
            else {
              local_190._M_dataplus._M_p = local_120._M_dataplus._M_p;
            }
            local_190.field_2._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
            local_120._M_string_length = 0;
            local_120.field_2._M_allocated_capacity =
                 local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_120._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_append((char *)&local_168,(ulong)local_190._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != paVar12) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
          local_d0 = &local_c0;
          local_c8 = 0;
          local_c0 = 0;
          _Var9._M_p = local_168.first._M_dataplus._M_p;
          if (local_168.first._M_string_length != 0) {
            uVar6 = 0;
            _Var13._M_p = local_168.first._M_dataplus._M_p;
            _Var16._M_p = local_168.first._M_dataplus._M_p;
            do {
              if (*_Var13._M_p == ' ') {
                _Var16._M_p = _Var13._M_p;
              }
              if (uVar15 < uVar6) {
                if (_Var16._M_p == _Var9._M_p) {
                  std::__cxx11::string::replace
                            ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
                  paVar12 = &local_80.field_2;
                  local_80.field_2._M_allocated_capacity._0_2_ = 10;
                  local_80._M_string_length = 1;
                  local_80._M_dataplus._M_p = (pointer)paVar12;
                  std::__cxx11::string::_M_append((char *)&local_d0,(ulong)paVar12);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != paVar12) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    CONCAT62(local_80.field_2._M_allocated_capacity._2_6_,
                                             local_80.field_2._M_allocated_capacity._0_2_) + 1);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,(char)local_100);
                  _Var9._M_p = _Var13._M_p + 1;
                  _Var16._M_p = _Var9._M_p;
                }
                else {
                  std::__cxx11::string::replace
                            ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
                  local_e8 = 10;
                  local_f0 = (_Base_ptr)0x1;
                  local_f8 = &local_e8;
                  std::__cxx11::string::_M_append((char *)&local_d0,(ulong)&local_e8);
                  if (local_f8 != &local_e8) {
                    operator_delete(local_f8,CONCAT53(uStack_e5,CONCAT12(uStack_e6,local_e8)) + 1);
                  }
                  std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,(char)local_100);
                  _Var9._M_p = _Var16._M_p + 1;
                }
                uVar6 = 0;
              }
              else {
                uVar6 = uVar6 + 1;
              }
              _Var13._M_p = _Var13._M_p + 1;
            } while (_Var13._M_p !=
                     local_168.first._M_dataplus._M_p + local_168.first._M_string_length);
          }
          std::__cxx11::string::replace((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var9._M_p);
          __return_storage_ptr__ = local_170;
          paVar12 = &local_168.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_168.first._M_dataplus._M_p,
                            local_168.first.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(local_d8->first)._M_dataplus._M_p);
          if (local_60 < (_Base_ptr)(local_d8->first)._M_string_length) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            paVar1 = &local_190.field_2;
            local_190._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p == paVar1) {
              local_168.first.field_2._8_8_ = local_190.field_2._8_8_;
              local_168.first._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_168.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
            }
            local_168.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
            local_168.first._M_string_length = local_190._M_string_length;
            local_190._M_string_length = 0;
            local_190.field_2._M_allocated_capacity =
                 local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_190._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_168.first._M_dataplus._M_p);
          }
          else {
            paVar1 = &local_190.field_2;
            local_190._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_190,
                       (char)local_100 - (char)(_Base_ptr)(local_d8->first)._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p == paVar1) {
              local_168.first.field_2._8_8_ = local_190.field_2._8_8_;
              local_168.first._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_168.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
            }
            local_168.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
            local_168.first._M_string_length = local_190._M_string_length;
            local_190._M_string_length = 0;
            local_190.field_2._M_allocated_capacity =
                 local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_190._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_168.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168.first._M_dataplus._M_p != paVar12) {
            operator_delete(local_168.first._M_dataplus._M_p,
                            local_168.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          local_d8 = local_d8 + 1;
        }
        p_Var10 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_b0[3]._M_single_bucket;
      } while (p_Var10 != local_38);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}